

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O1

void __thiscall pg::DTLSolver::run(DTLSolver *this)

{
  bitset *this_00;
  Game *pGVar1;
  uint64_t *puVar2;
  size_t sVar3;
  pointer ppiVar4;
  vector<int,_std::allocator<int>_> *pvVar5;
  pointer piVar6;
  void *pvVar7;
  undefined1 auVar8 [16];
  size_t sVar9;
  bool bVar10;
  bool bVar11;
  ulong uVar12;
  ulong uVar13;
  ulong *puVar14;
  int *piVar15;
  uint *puVar16;
  uint *puVar17;
  ostream *poVar18;
  Error *this_01;
  long *plVar19;
  size_t sVar20;
  ulong uVar21;
  uint64_t uVar22;
  long lVar23;
  int iVar24;
  int **x;
  pointer ppiVar25;
  pointer *ppiVar26;
  int iVar27;
  
  pGVar1 = (this->super_Solver).game;
  uVar21 = pGVar1->n_vertices;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar21;
  uVar12 = SUB168(auVar8 * ZEXT816(0x18),0);
  uVar13 = uVar12 + 8;
  if (0xfffffffffffffff7 < uVar12) {
    uVar13 = 0xffffffffffffffff;
  }
  uVar12 = 0xffffffffffffffff;
  if (SUB168(auVar8 * ZEXT816(0x18),8) == 0) {
    uVar12 = uVar13;
  }
  puVar14 = (ulong *)operator_new__(uVar12);
  *puVar14 = uVar21;
  if (uVar21 != 0) {
    memset((vector<int,_std::allocator<int>_> *)(puVar14 + 1),0,
           ((uVar21 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
  }
  this->tin = (vector<int,_std::allocator<int>_> *)(puVar14 + 1);
  piVar15 = (int *)operator_new__(-(ulong)((ulong)pGVar1->n_vertices >> 0x3e != 0) |
                                  pGVar1->n_vertices << 2);
  this->str = piVar15;
  piVar15 = (int *)operator_new__(-(ulong)((ulong)pGVar1->n_vertices >> 0x3e != 0) |
                                  pGVar1->n_vertices << 2);
  this->dvalue = piVar15;
  bitset::resize(&this->Z,pGVar1->n_vertices);
  bitset::resize(&this->S,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->W,((this->super_Solver).game)->n_vertices);
  this_00 = &this->G;
  bitset::operator=(this_00,(this->super_Solver).disabled);
  uVar21 = (this->G)._bitssize;
  if (uVar21 != 0) {
    puVar2 = this_00->_bits;
    uVar12 = 0;
    do {
      puVar2[uVar12] = ~puVar2[uVar12];
      uVar12 = uVar12 + 1;
      uVar21 = (this->G)._bitssize;
    } while (uVar12 < uVar21);
  }
  uVar12 = (this->G)._size & 0x3f;
  if (uVar12 != 0) {
    this_00->_bits[uVar21 - 1] = this_00->_bits[uVar21 - 1] & ~(-1L << uVar12);
  }
  pGVar1 = (this->super_Solver).game;
  uVar21 = pGVar1->n_vertices;
  uVar12 = 0xffffffffffffffff;
  if (uVar21 < 0x4000000000000000) {
    uVar12 = uVar21 * 4;
  }
  piVar15 = (int *)operator_new__(uVar12);
  this->Candidates = piVar15;
  bitset::resize(&this->Player,pGVar1->n_vertices);
  pGVar1 = (this->super_Solver).game;
  uVar21 = pGVar1->n_vertices;
  if (0 < (long)uVar21) {
    piVar15 = pGVar1->_priority;
    puVar2 = (this->Player)._bits;
    uVar12 = 0;
    do {
      uVar21 = uVar12 >> 6;
      uVar13 = 1L << (uVar12 & 0x3f);
      if ((*(byte *)(piVar15 + uVar12) & 1) == 0) {
        uVar22 = ~uVar13 & puVar2[uVar21];
      }
      else {
        uVar22 = uVar13 | puVar2[uVar21];
      }
      puVar2[uVar21] = uVar22;
      uVar12 = uVar12 + 1;
      uVar21 = pGVar1->n_vertices;
    } while ((long)uVar12 < (long)uVar21);
  }
  (this->Q).pointer = 0;
  puVar16 = (this->Q).queue;
  if (puVar16 != (uint *)0x0) {
    operator_delete__(puVar16);
  }
  puVar16 = (uint *)operator_new__((uVar21 & 0xffffffff) << 2);
  (this->Q).queue = puVar16;
  puVar16 = (this->SQ).queue;
  uVar21 = ((this->super_Solver).game)->n_vertices;
  (this->SQ).pointer = 0;
  if (puVar16 != (uint *)0x0) {
    operator_delete__(puVar16);
  }
  puVar16 = (uint *)operator_new__((uVar21 & 0xffffffff) << 2);
  (this->SQ).queue = puVar16;
  puVar16 = (this->Zvec).queue;
  uVar21 = ((this->super_Solver).game)->n_vertices;
  (this->Zvec).pointer = 0;
  if (puVar16 != (uint *)0x0) {
    operator_delete__(puVar16);
  }
  puVar16 = (uint *)operator_new__((uVar21 & 0xffffffff) << 2);
  (this->Zvec).queue = puVar16;
  puVar16 = (this->tangleto).queue;
  uVar21 = ((this->super_Solver).game)->n_vertices;
  (this->tangleto).pointer = 0;
  if (puVar16 != (uint *)0x0) {
    operator_delete__(puVar16);
  }
  puVar16 = (uint *)operator_new__((uVar21 & 0xffffffff) << 2);
  (this->tangleto).queue = puVar16;
  bitset::resize(&this->escapes,((this->super_Solver).game)->n_vertices);
  puVar16 = (this->pea_vS).queue;
  uVar21 = ((this->super_Solver).game)->n_vertices;
  (this->pea_vS).pointer = 0;
  if (puVar16 != (uint *)0x0) {
    operator_delete__(puVar16);
  }
  puVar16 = (uint *)operator_new__((uVar21 & 0xffffffff) << 2);
  (this->pea_vS).queue = puVar16;
  puVar16 = (this->pea_iS).queue;
  uVar21 = ((this->super_Solver).game)->n_vertices;
  (this->pea_iS).pointer = 0;
  if (puVar16 != (uint *)0x0) {
    operator_delete__(puVar16);
  }
  puVar16 = (uint *)operator_new__((uVar21 & 0xffffffff) << 2);
  (this->pea_iS).queue = puVar16;
  puVar16 = (this->pea_S).queue;
  uVar21 = ((this->super_Solver).game)->n_vertices;
  (this->pea_S).pointer = 0;
  if (puVar16 != (uint *)0x0) {
    operator_delete__(puVar16);
  }
  puVar16 = (uint *)operator_new__((uVar21 & 0xffffffff) << 2);
  (this->pea_S).queue = puVar16;
  pGVar1 = (this->super_Solver).game;
  uVar21 = pGVar1->n_vertices;
  uVar12 = 0xffffffffffffffff;
  if (uVar21 < 0x4000000000000000) {
    uVar12 = uVar21 * 4;
  }
  puVar17 = (uint *)operator_new__(uVar12);
  this->pea_vidx = puVar17;
  bitset::resize(&this->pea_root,pGVar1->n_vertices);
  if (this->interleaved == false) {
    iVar24 = 0;
    do {
      sVar3 = (this->G)._bitssize;
      sVar9 = 0;
      do {
        sVar20 = sVar9;
        if (sVar3 == sVar20) goto LAB_00178551;
        sVar9 = sVar20 + 1;
      } while ((this->G)._bits[sVar20] == 0);
      if (sVar3 == sVar20) break;
      if ((this->super_Solver).trace != 0) {
        poVar18 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,"\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m",0x21);
        poVar18 = (ostream *)std::ostream::operator<<(poVar18,this->iterations);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"-even\x1b[m\n",9);
      }
      this->iterations = this->iterations + 1;
      iVar24 = iVar24 + 1;
      bVar10 = search(this,0);
    } while (bVar10);
LAB_00178551:
    iVar27 = 0;
    do {
      sVar3 = (this->G)._bitssize;
      sVar9 = 0;
      do {
        sVar20 = sVar9;
        if (sVar3 == sVar20) goto LAB_001785da;
        sVar9 = sVar20 + 1;
      } while ((this->G)._bits[sVar20] == 0);
      if (sVar3 == sVar20) break;
      if ((this->super_Solver).trace != 0) {
        poVar18 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,"\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m",0x21);
        poVar18 = (ostream *)std::ostream::operator<<(poVar18,this->iterations);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"-odd\x1b[m\n",8);
      }
      this->iterations = this->iterations + 1;
      iVar27 = iVar27 + 1;
      bVar10 = search(this,1);
    } while (bVar10);
LAB_001785da:
    poVar18 = (this->super_Solver).logger;
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"found ",6);
    poVar18 = (ostream *)std::ostream::operator<<(poVar18,this->dominions);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18," dominions and ",0xf);
    poVar18 = (ostream *)std::ostream::operator<<(poVar18,this->tangles);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18," tangles.\n",10);
    poVar18 = (this->super_Solver).logger;
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"solved in ",10);
    poVar18 = (ostream *)std::ostream::operator<<(poVar18,this->iterations);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18," iterations and ",0x10);
    poVar18 = (ostream *)std::ostream::operator<<(poVar18,this->steps);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18," pruning steps.\n",0x10);
    poVar18 = (this->super_Solver).logger;
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"odd iterations: ",0x10);
    plVar19 = (long *)std::ostream::operator<<(poVar18,iVar27);
    std::ios::widen((char)*(undefined8 *)(*plVar19 + -0x18) + (char)plVar19);
    std::ostream::put((char)plVar19);
    std::ostream::flush();
    poVar18 = (this->super_Solver).logger;
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"even iterations: ",0x11);
    plVar19 = (long *)std::ostream::operator<<(poVar18,iVar24);
    std::ios::widen((char)*(undefined8 *)(*plVar19 + -0x18) + (char)plVar19);
    std::ostream::put((char)plVar19);
    std::ostream::flush();
    uVar21 = ((this->super_Solver).game)->n_vertices;
    if (0 < (long)uVar21) {
      uVar12 = 0;
      do {
        if ((((this->super_Solver).disabled)->_bits[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) == 0) {
          this_01 = (Error *)__cxa_allocate_exception(0x40);
          Error::Error(this_01,"search was incomplete!",
                       "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/dtl.cpp"
                       ,0x47d);
          goto LAB_0017886f;
        }
        uVar12 = uVar12 + 1;
      } while (uVar21 != uVar12);
    }
    ppiVar4 = (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppiVar25 = (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppiVar25 != ppiVar4; ppiVar25 = ppiVar25 + 1)
    {
      if (*ppiVar25 != (int *)0x0) {
        operator_delete__(*ppiVar25);
      }
    }
    ppiVar4 = (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppiVar25 = (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppiVar25 != ppiVar4; ppiVar25 = ppiVar25 + 1)
    {
      if (*ppiVar25 != (int *)0x0) {
        operator_delete__(*ppiVar25);
      }
    }
    pvVar5 = this->tin;
    if (pvVar5 != (vector<int,_std::allocator<int>_> *)0x0) {
      piVar6 = pvVar5[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      ppiVar26 = &pvVar5[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      if (piVar6 != (pointer)0x0) {
        lVar23 = (long)piVar6 * 0x18;
        do {
          pvVar7 = *(void **)((long)&pvVar5[-1].super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar23);
          if (pvVar7 != (void *)0x0) {
            operator_delete(pvVar7,*(long *)((long)ppiVar26 + lVar23) - (long)pvVar7);
          }
          lVar23 = lVar23 + -0x18;
        } while (lVar23 != 0);
      }
      operator_delete__(ppiVar26,(long)piVar6 * 0x18 + 8);
    }
    if (this->str != (int *)0x0) {
      operator_delete__(this->str);
    }
    if (this->pea_vidx != (uint *)0x0) {
      operator_delete__(this->pea_vidx);
    }
    if (this->Candidates != (int *)0x0) {
      operator_delete__(this->Candidates);
    }
    if (this->dvalue == (int *)0x0) {
      return;
    }
    operator_delete__(this->dvalue);
    return;
  }
  do {
    this->iterations = this->iterations + 1;
    sVar3 = (this->G)._bitssize;
    sVar9 = 0;
    do {
      sVar20 = sVar9;
      iVar27 = 0;
      if (sVar3 == sVar20) goto LAB_001785d7;
      sVar9 = sVar20 + 1;
    } while ((this->G)._bits[sVar20] == 0);
    if (sVar3 == sVar20) {
LAB_001785d7:
      iVar24 = 0;
      goto LAB_001785da;
    }
    if ((this->super_Solver).trace != 0) {
      poVar18 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar18,"\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m",0x21);
      poVar18 = (ostream *)std::ostream::operator<<(poVar18,this->iterations + -1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"-even\x1b[m\n",9);
    }
    bVar10 = search(this,0);
    sVar3 = (this->G)._bitssize;
    sVar9 = 0;
    do {
      sVar20 = sVar9;
      if (sVar3 == sVar20) goto LAB_001785d7;
      sVar9 = sVar20 + 1;
    } while ((this->G)._bits[sVar20] == 0);
    iVar24 = 0;
    if (sVar3 == sVar20) goto LAB_001785da;
    if ((this->super_Solver).trace != 0) {
      poVar18 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar18,"\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m",0x21);
      poVar18 = (ostream *)std::ostream::operator<<(poVar18,this->iterations + -1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"-odd\x1b[m\n",8);
    }
    bVar11 = search(this,1);
  } while (bVar10 || bVar11);
  this_01 = (Error *)__cxa_allocate_exception(0x40);
  Error::Error(this_01,"solver stuck",
               "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/dtl.cpp"
               ,0x470);
LAB_0017886f:
  __cxa_throw(this_01,&Error::typeinfo,Error::~Error);
}

Assistant:

void
DTLSolver::run()
{
    tin = new std::vector<int>[nodecount()];
    str = new int[nodecount()];

    dvalue = new int[nodecount()];

    Z.resize(nodecount());
    S.resize(nodecount());
    W.resize(nodecount());
    G = disabled;
    G.flip();

    Candidates = new int[nodecount()];

    Player.resize(nodecount());
    for (int v=0; v<nodecount(); v++) Player[v] = priority(v)&1;

    Q.resize(nodecount());
    SQ.resize(nodecount());

    Zvec.resize(nodecount());
    tangleto.resize(nodecount());
    escapes.resize(nodecount());

    pea_vS.resize(nodecount());
    pea_iS.resize(nodecount());
    pea_S.resize(nodecount());
    pea_vidx = new unsigned int[nodecount()];
    pea_root.resize(nodecount());

    int even_iterations = 0;
    int odd_iterations = 0;

    if (!interleaved) {
        // First solve for player Odd, then solve for player Even

        while (G.any()) {
            if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations << "-even\033[m\n";
            iterations++;
            even_iterations++;
            if (!search(0)) break;
        }

        while (G.any()) {
            if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations << "-odd\033[m\n";
            iterations++;
            odd_iterations++;
            if (!search(1)) break;
        }
    } else {
        // Interleave solving for player Even and player Odd

        while (true) {
            iterations++;

            if (!G.any()) break;
            if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations-1 << "-even\033[m\n";
            bool found0 = search(0);

            if (!G.any()) break;
            if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations-1 << "-odd\033[m\n";
            bool found1 = search(1);

            if (!found0 and !found1) THROW_ERROR("solver stuck");
            
        }
    }

    logger << "found " << dominions << " dominions and "<< tangles << " tangles.\n";
    logger << "solved in " << iterations << " iterations and " << steps << " pruning steps.\n";
    logger << "odd iterations: " << odd_iterations << std::endl;
    logger << "even iterations: " << even_iterations << std::endl;

#ifndef NDEBUG
    // Check if the whole game is now solved
    for (int i=0; i<nodecount(); i++) {
        if (!disabled[i]) { THROW_ERROR("search was incomplete!"); }
    }
#endif

    // Free all explicitly allocated memory
    for (auto &x : tv) delete[] x;
    for (auto &x : tout) delete[] x;
    delete[] tin;
    delete[] str;
    delete[] pea_vidx;
    delete[] Candidates;
    delete[] dvalue;
}